

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

hwaddr ppc_cpu_get_phys_page_debug_ppc64(CPUState *cs,vaddr addr)

{
  int iVar1;
  hwaddr hVar2;
  mmu_ctx_t_conflict ctx;
  
  iVar1 = *(int *)(cs[3].tb_jmp_cache + 0x8d8);
  if (iVar1 - 0x10001U < 4) {
    hVar2 = ppc_hash64_get_phys_page_debug((PowerPCCPU_conflict3 *)cs,addr);
    return hVar2;
  }
  if ((iVar1 == 1) || (iVar1 == 10)) {
    hVar2 = ppc_hash32_get_phys_page_debug_ppc64((PowerPCCPU_conflict3 *)cs,addr);
    return hVar2;
  }
  if (iVar1 == 0x10005) {
    hVar2 = ppc64_v3_get_phys_page_debug((PowerPCCPU_conflict3 *)cs,addr);
    return hVar2;
  }
  iVar1 = get_physical_address_wtlb
                    ((CPUPPCState_conflict2 *)(cs[1].tb_jmp_cache + 0x359),&ctx,addr,0,0x20,0);
  if ((iVar1 != 0) &&
     (iVar1 = get_physical_address_wtlb
                        ((CPUPPCState_conflict2 *)(cs[1].tb_jmp_cache + 0x359),&ctx,addr,0,0x10,0),
     iVar1 != 0)) {
    return 0xffffffffffffffff;
  }
  return ctx.raddr & 0xfffffffffffff000;
}

Assistant:

hwaddr ppc_cpu_get_phys_page_debug(CPUState *cs, vaddr addr)
{
    PowerPCCPU *cpu = POWERPC_CPU(cs);
    CPUPPCState *env = &cpu->env;
    mmu_ctx_t ctx;

    switch (env->mmu_model) {
#if defined(TARGET_PPC64)
    case POWERPC_MMU_64B:
    case POWERPC_MMU_2_03:
    case POWERPC_MMU_2_06:
    case POWERPC_MMU_2_07:
        return ppc_hash64_get_phys_page_debug(cpu, addr);
    case POWERPC_MMU_3_00:
        return ppc64_v3_get_phys_page_debug(cpu, addr);
#endif

    case POWERPC_MMU_32B:
    case POWERPC_MMU_601:
        return ppc_hash32_get_phys_page_debug(cpu, addr);

    default:
        ;
    }

    if (unlikely(get_physical_address(env, &ctx, addr, 0, ACCESS_INT) != 0)) {

        /*
         * Some MMUs have separate TLBs for code and data. If we only
         * try an ACCESS_INT, we may not be able to read instructions
         * mapped by code TLBs, so we also try a ACCESS_CODE.
         */
        if (unlikely(get_physical_address(env, &ctx, addr, 0,
                                          ACCESS_CODE) != 0)) {
            return -1;
        }
    }

    return ctx.raddr & TARGET_PAGE_MASK;
}